

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall
capnp::compiler::Compiler::Node::traverse
          (Node *this,uint eagerness,
          unordered_map<capnp::compiler::Compiler::Node_*,_unsigned_int,_std::hash<capnp::compiler::Compiler::Node_*>,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>_>
          *seen,SchemaLoader *finalLoader,
          Vector<capnp::schema::Node::SourceInfo::Reader> *sourceInfo)

{
  size_t sVar1;
  Reader *__src;
  Reader *pRVar2;
  Reader *pRVar3;
  Node *this_00;
  Node **ppNVar4;
  Maybe<capnp::schema::Node::Reader> *pMVar5;
  mapped_type *pmVar6;
  Maybe<capnp::compiler::Compiler::Node::Content_&> MVar7;
  anon_union_48_1_a8c68091_for_NullableValue<capnp::schema::Node::Reader>_2 *paVar8;
  Maybe<capnp::compiler::Compiler::Node::Content_&> MVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  uint eagerness_00;
  RemoveConst<capnp::schema::Node::SourceInfo::Reader> *__dest;
  ulong newSize;
  long lVar12;
  Reader *aux;
  Reader *schemaNode;
  Node **ppNVar13;
  _Rb_tree_header *p_Var14;
  Node *local_110;
  Reader local_108;
  Maybe<kj::OneOf<capnp::compiler::NodeTranslator::Resolver::ResolvedDecl,_capnp::compiler::NodeTranslator::Resolver::ResolvedParameter>_>
  local_d8;
  
  local_110 = this;
  pmVar6 = std::__detail::
           _Map_base<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<capnp::compiler::Compiler::Node_*,_std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>,_std::allocator<std::pair<capnp::compiler::Compiler::Node_*const,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<capnp::compiler::Compiler::Node_*>,_std::hash<capnp::compiler::Compiler::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)seen,&local_110);
  if ((eagerness & ~*pmVar6) == 0) {
    return;
  }
  *pmVar6 = *pmVar6 | eagerness;
  MVar7 = getContent(this,FINISHED);
  if (MVar7.ptr == (Content *)0x0) goto LAB_001556de;
  loadFinalSchema(this,finalLoader);
  if ((this->loadedFinalSchema).ptr.isSet == true) {
    pMVar5 = &this->loadedFinalSchema;
LAB_00155592:
    paVar8 = &(pMVar5->ptr).field_1;
    local_108._reader.segment = (paVar8->value)._reader.segment;
    local_108._reader.capTable = (paVar8->value)._reader.capTable;
    local_108._reader.data = (paVar8->value)._reader.data;
    local_108._reader.pointers = (paVar8->value)._reader.pointers;
    local_108._reader.dataSize = ((StructReader *)paVar8)->dataSize;
    local_108._reader.pointerCount = ((StructReader *)paVar8)->pointerCount;
    local_108._reader._38_2_ = *(undefined2 *)&((StructReader *)paVar8)->field_0x26;
    local_108._reader.nestingLimit = ((StructReader *)paVar8)->nestingLimit;
    local_108._reader._44_4_ = *(undefined4 *)&((StructReader *)paVar8)->field_0x2c;
    local_110 = (Node *)CONCAT71(local_110._1_7_,1);
    if (0x7fff < eagerness) {
      eagerness_00 = eagerness & 0xffff8000 | eagerness >> 0xf;
      traverseNodeDependencies(this,&local_108,eagerness_00,seen,finalLoader,sourceInfo);
      sVar1 = ((MVar7.ptr)->auxSchemas).size_;
      if (sVar1 != 0) {
        schemaNode = ((MVar7.ptr)->auxSchemas).ptr;
        lVar12 = sVar1 * 0x30;
        do {
          traverseNodeDependencies(this,schemaNode,eagerness_00,seen,finalLoader,sourceInfo);
          schemaNode = schemaNode + 1;
          lVar12 = lVar12 + -0x30;
        } while (lVar12 != 0);
      }
    }
  }
  else {
    MVar9 = getContent(this,FINISHED);
    if ((MVar9.ptr != (Content *)0x0) && (((MVar9.ptr)->finalSchema).ptr.isSet == true)) {
      pMVar5 = &(MVar9.ptr)->finalSchema;
      goto LAB_00155592;
    }
  }
  __src = ((MVar7.ptr)->sourceInfo).ptr;
  sVar1 = ((MVar7.ptr)->sourceInfo).size_;
  pRVar2 = (sourceInfo->builder).ptr;
  __dest = (sourceInfo->builder).pos;
  uVar10 = ((long)__dest - (long)pRVar2 >> 4) * -0x5555555555555555 + sVar1;
  pRVar3 = (sourceInfo->builder).endPtr;
  lVar12 = (long)pRVar3 - (long)pRVar2 >> 4;
  if ((ulong)(lVar12 * -0x5555555555555555) < uVar10) {
    newSize = 4;
    if (pRVar3 != pRVar2) {
      newSize = lVar12 * 0x5555555555555556;
    }
    if (newSize < uVar10) {
      newSize = uVar10;
    }
    kj::Vector<capnp::schema::Node::SourceInfo::Reader>::setCapacity(sourceInfo,newSize);
    __dest = (sourceInfo->builder).pos;
  }
  if (sVar1 != 0) {
    memcpy(__dest,__src,sVar1 * 0x30);
  }
  (sourceInfo->builder).pos = __dest + sVar1;
LAB_001556de:
  if (((eagerness & 2) != 0) && (this_00 = (this->parent).ptr, this_00 != (Node *)0x0)) {
    traverse(this_00,eagerness,seen,finalLoader,sourceInfo);
  }
  if (((eagerness & 4) != 0) && (MVar7 = getContent(this,EXPANDED), MVar7.ptr != (Content *)0x0)) {
    ppNVar4 = ((MVar7.ptr)->orderedNestedNodes).builder.pos;
    for (ppNVar13 = ((MVar7.ptr)->orderedNestedNodes).builder.ptr; ppNVar13 != ppNVar4;
        ppNVar13 = ppNVar13 + 1) {
      traverse(*ppNVar13,eagerness,seen,finalLoader,sourceInfo);
    }
    p_Var11 = ((MVar7.ptr)->aliases)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var14 = &((MVar7.ptr)->aliases)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var11 != p_Var14) {
      do {
        Alias::compile(&local_d8,(Alias *)p_Var11[1]._M_right);
        if ((local_d8.ptr.isSet == true) && (local_d8.ptr.field_1.value.tag - 1 < 2)) {
          local_d8.ptr.field_1.value.tag = 0;
        }
        p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
      } while ((_Rb_tree_header *)p_Var11 != p_Var14);
    }
  }
  return;
}

Assistant:

void Compiler::Node::traverse(uint eagerness, std::unordered_map<Node*, uint>& seen,
                              const SchemaLoader& finalLoader,
                              kj::Vector<schema::Node::SourceInfo::Reader>& sourceInfo) {
  uint& slot = seen[this];
  if ((slot & eagerness) == eagerness) {
    // We've already covered this node.
    return;
  }
  slot |= eagerness;

  KJ_IF_MAYBE(content, getContent(Content::FINISHED)) {
    loadFinalSchema(finalLoader);

    KJ_IF_MAYBE(schema, getFinalSchema()) {
      if (eagerness / DEPENDENCIES != 0) {
        // For traversing dependencies, discard the bits lower than DEPENDENCIES and replace
        // them with the bits above DEPENDENCIES shifted over.
        uint newEagerness = (eagerness & ~(DEPENDENCIES - 1)) | (eagerness / DEPENDENCIES);

        traverseNodeDependencies(*schema, newEagerness, seen, finalLoader, sourceInfo);
        for (auto& aux: content->auxSchemas) {
          traverseNodeDependencies(aux, newEagerness, seen, finalLoader, sourceInfo);
        }
      }
    }

    sourceInfo.addAll(content->sourceInfo);
  }

  if (eagerness & PARENTS) {
    KJ_IF_MAYBE(p, parent) {
      p->traverse(eagerness, seen, finalLoader, sourceInfo);
    }
  }

  if (eagerness & CHILDREN) {
    KJ_IF_MAYBE(content, getContent(Content::EXPANDED)) {
      for (auto& child: content->orderedNestedNodes) {
        child->traverse(eagerness, seen, finalLoader, sourceInfo);
      }

      // Also traverse `using` declarations.
      for (auto& child: content->aliases) {
        child.second->compile();
      }
    }
  }
}